

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void CleanNode(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *local_40;
  AttVal *local_38;
  AttVal *id;
  Node *next;
  Node *child;
  Stack *stack;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  stack = (Stack *)node;
  node_local = &doc->root;
  child = (Node *)prvTidynewStack(doc,0x10);
  next = *(Node **)(stack + 1);
  if (next == (Node *)0x0) {
    return;
  }
  do {
    while( true ) {
      if (next == (Node *)0x0) {
        prvTidyfreeStack((Stack *)child);
        return;
      }
      id = (AttVal *)next->next;
      BVar1 = prvTidynodeIsElement(next);
      if (BVar1 != no) break;
LAB_0016def5:
      if (id == (AttVal *)0x0) {
        local_40 = prvTidypop((Stack *)child);
      }
      else {
        local_40 = (Node *)id;
      }
      next = local_40;
    }
    if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_STYLE)) {
      prvTidyDiscardElement((TidyDocImpl *)node_local,next);
    }
    if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) &&
       ((next->tag->id == TidyTag_P && (next->content == (Node *)0x0)))) {
      prvTidyDiscardElement((TidyDocImpl *)node_local,next);
      goto LAB_0016def5;
    }
    if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_SPAN)) {
      DiscardContainer((TidyDocImpl *)node_local,next,(Node **)&id);
      goto LAB_0016def5;
    }
    if ((((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_A)) &&
       (next->content == (Node *)0x0)) {
      local_38 = prvTidyGetAttrByName(next,"name");
      if (local_38 == (AttVal *)0x0) {
        local_38 = prvTidyGetAttrByName(next,anon_var_dwarf_417cb + 0x2b);
      }
      if (local_38 != (AttVal *)0x0) {
        prvTidyRepairAttrValue
                  ((TidyDocImpl *)node_local,next->parent,anon_var_dwarf_417cb + 0x2b,
                   local_38->value);
      }
      prvTidyDiscardElement((TidyDocImpl *)node_local,next);
      goto LAB_0016def5;
    }
    if (next->attributes != (AttVal *)0x0) {
      prvTidyDropAttrByName((TidyDocImpl *)node_local,next,"class");
    }
    prvTidypush((Stack *)child,(Node *)id);
    next = next->content;
  } while( true );
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}